

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void __thiscall VmValue::RemoveUse(VmValue *this,VmValue *user)

{
  VmValue **ppVVar1;
  char *pcVar2;
  long lVar3;
  VmBlock *this_00;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  int local_14;
  VmConstant *local_10;
  
  uVar5 = (this->users).count;
  if ((ulong)uVar5 == 0) {
LAB_001a4056:
    if ((this->hasSideEffects == false) && (this->canBeRemoved == true)) {
      switch(this->typeID) {
      case 1:
        pcVar2 = this[1].comment.end;
        if (pcVar2 != (char *)0x0) {
          uVar5 = *(uint *)(pcVar2 + 0x50);
          if ((ulong)uVar5 != 0) {
            lVar3 = *(long *)(pcVar2 + 0x48);
            uVar6 = 0;
            do {
              if (*(VmValue **)(lVar3 + uVar6 * 8) == this) {
                *(undefined8 *)(lVar3 + uVar6 * 8) = *(undefined8 *)(lVar3 + (ulong)(uVar5 - 1) * 8)
                ;
                *(uint *)(pcVar2 + 0x50) = uVar5 - 1;
                local_14 = *(int *)&this[1]._vptr_VmValue + 1;
                local_10 = (VmConstant *)0x0;
                SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U>::insert
                          ((SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U> *)(pcVar2 + 0xa0),
                           &local_14,&local_10);
                return;
              }
              uVar6 = uVar6 + 1;
            } while (uVar5 != uVar6);
          }
          __assert_fail("found",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x79a,"void VmValue::RemoveUse(VmValue *)");
        }
        break;
      case 2:
        this_00 = (VmBlock *)this[1].users.data;
        if (this_00 != (VmBlock *)0x0) {
          VmBlock::RemoveInstruction(this_00,(VmInstruction *)this);
          return;
        }
        break;
      case 3:
        bVar4 = VmBlock::HasExternalInstructionUsers((VmBlock *)this);
        if (!bVar4) {
          while (*(VmInstruction **)&this[1].hasSideEffects != (VmInstruction *)0x0) {
            VmBlock::RemoveInstruction((VmBlock *)this,*(VmInstruction **)&this[1].hasSideEffects);
          }
        }
        break;
      case 4:
        break;
      default:
        __assert_fail("!\"unknown type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x7b1,"void VmValue::RemoveUse(VmValue *)");
      }
    }
  }
  else {
    ppVVar1 = (this->users).data;
    uVar6 = 0;
    do {
      if (ppVVar1[uVar6] == user) {
        uVar5 = uVar5 - 1;
        ppVVar1[uVar6] = ppVVar1[uVar5];
        (this->users).count = uVar5;
        this->hasKnownNonSimpleUse = false;
        if (uVar5 != 0) {
          return;
        }
        goto LAB_001a4056;
      }
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  return;
}

Assistant:

void VmValue::RemoveUse(VmValue* user)
{
	for(unsigned i = 0, e = users.count; i < e; i++)
	{
		if(users.data[i] == user)
		{
			users.data[i] = users.back();
			users.pop_back();

			// Might have removed last non-simple use
			hasKnownNonSimpleUse = false;
			break;
		}
	}

	if(users.count == 0 && !hasSideEffects && canBeRemoved)
	{
		if(VmConstant *constant = getType<VmConstant>(this))
		{
			if(VariableData *container = constant->container)
			{
				bool found = false;

				for(unsigned i = 0; i < container->users.size(); i++)
				{
					if(container->users[i] == constant)
					{
						found = true;

						container->users[i] = container->users.back();
						container->users.pop_back();

						container->offsetUsers.insert(constant->iValue + 1, NULL);
						break;
					}
				}

				(void)found;

				assert(found);
			}
		}
		else if(VmInstruction *instruction = getType<VmInstruction>(this))
		{
			if(instruction->parent)
				instruction->parent->RemoveInstruction(instruction);
		}
		else if(VmBlock *block = getType<VmBlock>(this))
		{
			if(!block->HasExternalInstructionUsers())
			{
				// Remove all block instructions
				while(block->lastInstruction)
					block->RemoveInstruction(block->lastInstruction);
			}
		}
		else if(isType<VmFunction>(this))
		{
			// Do not remove functions
		}
		else
		{
			assert(!"unknown type");
		}
	}
}